

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SteppingZomby.cpp
# Opt level: O0

void __thiscall SteppingZomby::Zomby::~Zomby(Zomby *this)

{
  Zomby *this_local;
  
  ~Zomby(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Zomby::~Zomby()
{
    _semaphore = false;

    if (_thread.joinable()) {
        _thread.detach();
    }

    if (_listener) {
        std::ostringstream buf;
        buf << typeid(*this).name() << "::" << __func__ << std::endl;
        _listener->processData(std::make_shared<Common::Listener::Data>(buf.str()));
    }
}